

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<Minisat::Solver::VarOrderLt>::percolateDown
          (Heap<Minisat::Solver::VarOrderLt> *this,int i)

{
  double dVar1;
  int iVar2;
  int iVar3;
  vec<double> *pvVar4;
  int *piVar5;
  int *piVar6;
  double *pdVar7;
  int iVar8;
  int iVar9;
  
  pvVar4 = (this->lt).activity;
  piVar5 = (this->heap).data;
  iVar2 = piVar5[i];
  piVar6 = (this->indices).data;
  while( true ) {
    iVar9 = i * 2 + 1;
    iVar3 = (this->heap).sz;
    if (iVar3 <= iVar9) break;
    iVar8 = i * 2 + 2;
    if ((iVar3 <= iVar8) ||
       (pdVar7 = pvVar4->data, dVar1 = pdVar7[piVar5[iVar8]], pdVar7 = pdVar7 + piVar5[iVar9],
       dVar1 < *pdVar7 || dVar1 == *pdVar7)) {
      iVar8 = iVar9;
    }
    iVar3 = piVar5[iVar8];
    pdVar7 = pvVar4->data;
    if (pdVar7[iVar3] <= pdVar7[iVar2]) break;
    piVar5[i] = iVar3;
    piVar6[iVar3] = i;
    i = iVar8;
  }
  piVar5[i] = iVar2;
  (this->indices).data[iVar2] = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        int x = heap[i];
        while (left(i) < heap.size()) {
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i] = heap[child];
            indices[heap[i]] = i;
            i = child;
        }
        heap[i] = x;
        indices[x] = i;
    }